

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_mbe.cpp
# Opt level: O2

void __thiscall DSDcc::DSDMBEDecoder::processAudio(DSDMBEDecoder *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  float *pfVar8;
  short *psVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if (this->m_auto_gain == true) {
    pfVar8 = this->m_audio_out_temp_buf;
    this->m_audio_out_temp_buf_p = pfVar8;
    fVar15 = 0.0;
    for (lVar7 = 0x3a; (int)lVar7 != 0xda; lVar7 = lVar7 + 1) {
      if (fVar15 <= ABS(*(float *)(this->imbe_d + lVar7 * 4 + -8))) {
        fVar15 = ABS(*(float *)(this->imbe_d + lVar7 * 4 + -8));
      }
    }
    pfVar5 = this->m_aout_max_buf_p;
    *pfVar5 = fVar15;
    this->m_aout_max_buf_p = pfVar5 + 1;
    iVar6 = this->m_aout_max_buf_idx;
    this->m_aout_max_buf_idx = iVar6 + 1;
    if (0x17 < iVar6) {
      this->m_aout_max_buf_idx = 0;
      this->m_aout_max_buf_p = this->m_aout_max_buf;
    }
    for (lVar7 = 0; lVar7 != 0x19; lVar7 = lVar7 + 1) {
      if (fVar15 <= this->m_aout_max_buf[lVar7]) {
        fVar15 = this->m_aout_max_buf[lVar7];
      }
    }
    fVar17 = (float)(~-(uint)(0.0 < fVar15) & 0x42480000 |
                    (uint)(30000.0 / fVar15) & -(uint)(0.0 < fVar15));
    fVar15 = this->m_aout_gain;
    if (fVar15 <= fVar17) {
      fVar16 = 50.0;
      if (fVar17 <= 50.0) {
        fVar16 = fVar17;
      }
      fVar17 = fVar16 - fVar15;
      if (fVar15 * 0.05 < fVar16 - fVar15) {
        fVar17 = fVar15 * 0.05;
      }
    }
    else {
      this->m_aout_gain = fVar17;
      fVar17 = 0.0;
    }
    lVar7 = 0;
    while( true ) {
      if ((int)lVar7 == 0xa0) break;
      pfVar8[lVar7] = (this->m_aout_gain + (float)(int)lVar7 * fVar17 * 0.00625) * pfVar8[lVar7];
      lVar7 = lVar7 + 1;
    }
    this->m_aout_gain = this->m_aout_gain + fVar17;
  }
  pfVar8 = this->m_audio_out_temp_buf;
  this->m_audio_out_temp_buf_p = pfVar8;
  iVar6 = this->m_upsample;
  if ((long)iVar6 < 2) {
    iVar6 = this->m_audio_out_nb_samples + 0xa0;
    if (iVar6 < this->m_audio_out_buf_size) {
      psVar9 = this->m_audio_out_buf_p;
    }
    else {
      psVar9 = this->m_audio_out_buf;
      iVar6 = 0xa0;
    }
    this->m_audio_out_float_buf_p = this->m_audio_out_float_buf;
    bVar14 = this->m_stereo;
    iVar12 = this->m_audio_out_idx;
    iVar4 = this->m_audio_out_idx2;
    for (lVar7 = 0xe8; (int)lVar7 != 0x368; lVar7 = lVar7 + 4) {
      fVar15 = *(float *)(this->imbe_d + lVar7 + -8);
      fVar17 = 32760.0;
      if ((32760.0 < fVar15) || (fVar17 = -32760.0, fVar15 < -32760.0)) {
        *(float *)(this->imbe_d + lVar7 + -8) = fVar17;
        fVar15 = fVar17;
      }
      *psVar9 = (short)(int)fVar15;
      if (bVar14 == false) {
        psVar9 = psVar9 + 1;
      }
      else {
        psVar9[1] = (short)(int)fVar15;
        psVar9 = psVar9 + 2;
      }
    }
    this->m_audio_out_temp_buf_p = (float *)(this->imbe_d + lVar7 + -8);
    this->m_audio_out_buf_p = psVar9;
    this->m_audio_out_nb_samples = iVar6;
    this->m_audio_out_idx = iVar12 + 0xa0;
    this->m_audio_out_idx2 = iVar4 + 0xa0;
  }
  else {
    if (this->m_audio_out_buf_size <= this->m_audio_out_nb_samples + iVar6 * 0xa0) {
      this->m_audio_out_nb_samples = 0;
      this->m_audio_out_buf_p = this->m_audio_out_buf;
    }
    pfVar5 = this->m_audio_out_float_buf;
    this->m_audio_out_float_buf_p = pfVar5;
    iVar12 = 0xa0;
    while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
      upsample(this,iVar6,*pfVar8);
      pfVar8 = this->m_audio_out_temp_buf_p + 1;
      this->m_audio_out_temp_buf_p = pfVar8;
      this->m_audio_out_float_buf_p = this->m_audio_out_float_buf_p + iVar6;
      uVar1 = this->m_audio_out_idx;
      uVar2 = this->m_audio_out_idx2;
      this->m_audio_out_idx = uVar1 + iVar6;
      this->m_audio_out_idx2 = uVar2 + iVar6;
    }
    this->m_audio_out_float_buf_p = pfVar5;
    iVar12 = this->m_audio_out_nb_samples;
    bVar14 = this->m_stereo;
    bVar3 = this->m_channels;
    psVar9 = this->m_audio_out_buf_p;
    pfVar8 = pfVar5;
    for (lVar7 = 0; iVar6 * 0xa0 != (int)lVar7; lVar7 = lVar7 + 1) {
      fVar15 = pfVar5[lVar7];
      fVar17 = 32760.0;
      if ((32760.0 < fVar15) || (fVar17 = -32760.0, fVar15 < -32760.0)) {
        pfVar5[lVar7] = fVar17;
        fVar15 = fVar17;
      }
      sVar10 = (short)(int)fVar15;
      if ((bVar14 & 1U) == 0) {
        *psVar9 = sVar10;
        lVar13 = 2;
      }
      else {
        sVar11 = sVar10;
        if ((bVar3 & 1) == 0) {
          sVar11 = 0;
        }
        *psVar9 = sVar11;
        if ((bVar3 & 2) == 0) {
          sVar10 = 0;
        }
        psVar9[1] = sVar10;
        lVar13 = 4;
      }
      psVar9 = (short *)((long)psVar9 + lVar13);
      iVar12 = iVar12 + 1;
      pfVar8 = pfVar8 + 1;
    }
    this->m_audio_out_buf_p = psVar9;
    this->m_audio_out_nb_samples = iVar12;
    this->m_audio_out_float_buf_p = pfVar8;
  }
  return;
}

Assistant:

void DSDMBEDecoder::processAudio()
{
    int i, n;
    float aout_abs, max, gainfactor, gaindelta, maxbuf;

    if (m_auto_gain)
    {
        // detect max level
        max = 0;
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            aout_abs = fabsf(*m_audio_out_temp_buf_p);

            if (aout_abs > max)
            {
                max = aout_abs;
            }

            m_audio_out_temp_buf_p++;
        }

        *m_aout_max_buf_p = max;
        m_aout_max_buf_p++;
        m_aout_max_buf_idx++;

        if (m_aout_max_buf_idx > 24)
        {
            m_aout_max_buf_idx = 0;
            m_aout_max_buf_p = m_aout_max_buf;
        }

        // lookup max history
        for (i = 0; i < 25; i++)
        {
            maxbuf = m_aout_max_buf[i];

            if (maxbuf > max)
            {
                max = maxbuf;
            }
        }

        // determine optimal gain level
        if (max > (float) 0)
        {
            gainfactor = ((float) 30000 / max);
        }
        else
        {
            gainfactor = (float) 50;
        }

        if (gainfactor < m_aout_gain)
        {
            m_aout_gain = gainfactor;
            gaindelta = (float) 0;
        }
        else
        {
            if (gainfactor > (float) 50)
            {
                gainfactor = (float) 50;
            }

            gaindelta = gainfactor - m_aout_gain;

            if (gaindelta > ((float) 0.05 * m_aout_gain))
            {
                gaindelta = ((float) 0.05 * m_aout_gain);
            }
        }

        gaindelta /= (float) 160;

        // adjust output gain
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            *m_audio_out_temp_buf_p = (m_aout_gain
                    + ((float) n * gaindelta)) * (*m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
        }

        m_aout_gain += ((float) 160 * gaindelta);
    }
    else
    {
        gaindelta = (float) 0;
    }

    // copy audio data to output buffer and upsample if necessary
    m_audio_out_temp_buf_p = m_audio_out_temp_buf;

    //if ((m_upsample == 6) || (m_upsample == 7)) // upsampling to 48k
    if (m_upsample >= 2)
    {
        int upsampling = m_upsample;

        if (m_audio_out_nb_samples + (160*upsampling) >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            upsample(upsampling, *m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
            m_audio_out_float_buf_p += upsampling;
            m_audio_out_idx += upsampling;
            m_audio_out_idx2 += upsampling;
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        // copy to output (short) buffer
        for (n = 0; n < (160*upsampling); n++)
        {
            if (*m_audio_out_float_buf_p > (float) 32760)
            {
                *m_audio_out_float_buf_p = (float) 32760;
            }
            else if (*m_audio_out_float_buf_p < (float) -32760)
            {
                *m_audio_out_float_buf_p = (float) -32760;
            }


            if (m_stereo) // produce two channels
            {
            	if (m_channels & 1) { // left channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;

                if ((m_channels>>1) & 1) { // right channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;
            }
            else // single (mono) channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_float_buf_p++;
        }
    }
    else // leave at 8k
    {
        if (m_audio_out_nb_samples + 160 >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            if (*m_audio_out_temp_buf_p > (float) 32760)
            {
                *m_audio_out_temp_buf_p = (float) 32760;
            }
            else if (*m_audio_out_temp_buf_p < (float) -32760)
            {
                *m_audio_out_temp_buf_p = (float) -32760;
            }

            *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
            m_audio_out_buf_p++;

            if (m_stereo) // produce second channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_temp_buf_p++;
            m_audio_out_idx++;
            m_audio_out_idx2++;
        }
    }
}